

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double chi_mean(double a,double b,double c)

{
  double dVar1;
  double dVar2;
  
  dVar1 = tgamma((c + 1.0) * 0.5);
  dVar2 = tgamma(c * 0.5);
  return (dVar1 * b * 1.4142135623730951) / dVar2 + a;
}

Assistant:

double chi_mean ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_MEAN returns the mean of the Chi PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double MEAN, the mean value.
//
{
  double mean;

  mean = a + sqrt ( 2.0 ) * b * tgamma ( 0.5 * ( c + 1.0 ) )
  / tgamma ( 0.5 * c );

  return mean;
}